

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O2

void __thiscall
reader_authority_suite::test_ipv6_line_7a_v4::test_method(test_ipv6_line_7a_v4 *this)

{
  undefined4 local_f0;
  value local_ec;
  view_type local_e8;
  undefined8 *local_d8;
  char *local_d0;
  char input [16];
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  authority reader;
  
  local_e8.ptr_ = input;
  builtin_strncpy(input,"[1111::1.2.3.4]",0x10);
  local_e8.len_ = strlen(local_e8.ptr_);
  trial::url::reader::basic_authority<char>::basic_authority(&reader,&local_e8);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x161);
  local_e8.len_ = local_e8.len_ & 0xffffffffffffff00;
  local_e8.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_80 = "";
  local_ec = reader.super_base<char,_trial::url::reader::basic_authority>.current_token;
  local_f0 = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_e8,&local_88,0x161,2,2,&local_ec,"reader.subcode()",&local_f0,
             "url::token::subcode::authority_host_ipv6");
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0x162);
  local_e8.len_ = local_e8.len_ & 0xffffffffffffff00;
  local_e8.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[14]>
            (&local_e8,&local_b8,0x162,2,2,
             &reader.super_base<char,_trial::url::reader::basic_authority>.current_view,
             "reader.literal()","1111::1.2.3.4","\"1111::1.2.3.4\"");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ipv6_line_7a_v4)
{
    const char input[] = "[1111::1.2.3.4]";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_ipv6);
    BOOST_REQUIRE_EQUAL(reader.literal(), "1111::1.2.3.4");
}